

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeTextUtil.cc
# Opt level: O3

void __thiscall
encodeTextUtil::encodeTextUtil(encodeTextUtil *this,int *lockParameters,char **names,int lockIndex)

{
  char cVar1;
  undefined1 uVar2;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *this_00;
  int iVar3;
  uint uVar4;
  _Self __tmp;
  lock *this_01;
  _Base_ptr p_Var5;
  mapped_type *ppdVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  duplicateKeys *pdVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  _Rb_tree_header *p_Var12;
  char *key;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> duplicates;
  timespec seedTime;
  char local_92;
  char local_91;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *local_90;
  _Base_ptr local_88;
  uint local_7c;
  char *local_78;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_70;
  timespec local_40;
  
  local_90 = &this->characterToKeyObject;
  p_Var5 = &(this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var5;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->characterToKeyObjectIterator)._M_node = (_Base_ptr)0x0;
  this_01 = (lock *)operator_new(0x40);
  lock::lock(this_01,lockParameters + lockIndex * 3,names[lockIndex]);
  this->lockObject = this_01;
  clock_gettime(1,&local_40);
  local_7c = (uint)local_40.tv_nsec;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar11 = false;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = p_Var5;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0010284c:
  p_Var12 = &local_70._M_impl.super__Rb_tree_header;
  iVar3 = rand_r(&local_7c);
  (this->overlay).seed = iVar3;
  lock::check(this->lockObject,(char *)this,4);
  uVar4 = lock::getARealKey(this->lockObject,&local_78);
  if ((int)uVar4 < 7) {
    fprintf(_stderr,"Shouldn\'t have gotten a key this small: %d",(ulong)uVar4);
  }
  else {
    cVar1 = local_78[(ulong)uVar4 - 1];
    p_Var8 = (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = p_Var5;
    if (p_Var8 == (_Base_ptr)0x0) {
LAB_00102955:
      (this->characterToKeyObjectIterator)._M_node = p_Var10;
    }
    else {
      do {
        if (cVar1 <= (char)*(size_t *)(p_Var8 + 1)) {
          p_Var5 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[(char)*(size_t *)(p_Var8 + 1) < cVar1];
      } while (p_Var8 != (_Base_ptr)0x0);
      p_Var10 = local_88;
      if (p_Var5 == local_88) goto LAB_00102955;
      uVar2 = (undefined1)p_Var5[1]._M_color;
      if (cVar1 < (char)uVar2) {
        p_Var5 = local_88;
      }
      (this->characterToKeyObjectIterator)._M_node = p_Var5;
      if ((char)uVar2 <= cVar1) {
        local_92 = cVar1;
        ppdVar6 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](local_90,&local_92);
        pdVar9 = *ppdVar6;
        iVar3 = lock::seedOf(this->lockObject);
        iVar3 = duplicateKeys::insert(pdVar9,iVar3);
        local_91 = cVar1;
        pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_70,&local_91);
        p_Var5 = local_88;
        *pmVar7 = iVar3;
        if (local_70._M_impl.super__Rb_tree_header._M_node_count < 0x100) goto LAB_001029d7;
        if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left == p_Var12)
        goto LAB_001029ff;
        bVar11 = true;
        p_Var8 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          bVar11 = (bool)(bVar11 & 3 < *(int *)&p_Var8[1].field_0x4);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var12);
        goto LAB_001029d7;
      }
    }
    pdVar9 = (duplicateKeys *)operator_new(0x10);
    duplicateKeys::duplicateKeys(pdVar9);
    this_00 = local_90;
    local_92 = cVar1;
    ppdVar6 = std::
              map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
              ::operator[](local_90,&local_92);
    *ppdVar6 = pdVar9;
    local_92 = cVar1;
    ppdVar6 = std::
              map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
              ::operator[](this_00,&local_92);
    pdVar9 = *ppdVar6;
    iVar3 = lock::seedOf(this->lockObject);
    iVar3 = duplicateKeys::insert(pdVar9,iVar3);
    local_91 = cVar1;
    pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                         *)&local_70,&local_91);
    *pmVar7 = iVar3;
    p_Var5 = local_88;
  }
LAB_001029d7:
  if (bVar11) {
LAB_001029ff:
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~_Rb_tree(&local_70);
    return;
  }
  goto LAB_0010284c;
}

Assistant:

encodeTextUtil::encodeTextUtil(int * lockParameters, const char ** names, int lockIndex) {
  char * key;
  lockObject = new lock(lockParameters+3*lockIndex, *(names+lockIndex));
  int size;
  bool done = false;
  unsigned int rand_seed = 31416;
  struct timespec seedTime;
  clock_gettime(CLOCK_MONOTONIC, &seedTime);
  rand_seed = seedTime.tv_nsec & 0xffffffff;

  std::map<char, int>  duplicates;
  do {
    overlay.seed = rand_r(&rand_seed);
    lockObject->check(overlay.bytes, 4);
    size = lockObject->getARealKey(&key);
    if (size > 6) {
      int c = key[size - 1];
      characterToKeyObjectIterator = characterToKeyObject.find(c);
      if (characterToKeyObjectIterator != characterToKeyObject.end()) {
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
        if (duplicates.size() >= 256) {
          done = true;
          for (std::map<char, int>::iterator it = duplicates.begin(); it != duplicates.end(); it++) {
            done &= (it->second > 3);
          }
        }
      } else {
        characterToKeyObject[c] = new duplicateKeys();
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
      }
    } else {
      fprintf(stderr, "Shouldn't have gotten a key this small: %d", size);
    }
  } while (!done);
}